

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O0

void plutovg_paint_destroy(plutovg_paint_t *paint)

{
  int iVar1;
  plutovg_texture_paint_t *texture;
  plutovg_paint_t *paint_local;
  
  if ((paint != (plutovg_paint_t *)0x0) &&
     (iVar1 = paint->ref_count + -1, paint->ref_count = iVar1, iVar1 == 0)) {
    if (paint->type == PLUTOVG_PAINT_TYPE_TEXTURE) {
      plutovg_surface_destroy((plutovg_surface_t *)paint[5]);
    }
    free(paint);
  }
  return;
}

Assistant:

void plutovg_paint_destroy(plutovg_paint_t* paint)
{
    if(paint == NULL)
        return;
    if(--paint->ref_count == 0) {
        if(paint->type == PLUTOVG_PAINT_TYPE_TEXTURE) {
            plutovg_texture_paint_t* texture = (plutovg_texture_paint_t*)(paint);
            plutovg_surface_destroy(texture->surface);
        }

        free(paint);
    }
}